

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall cmQtAutoGenInitializer::AddCleanFile(cmQtAutoGenInitializer *this,string *fileName)

{
  cmTarget *this_00;
  allocator<char> local_51;
  _Optional_payload_base<cmListFileBacktrace> local_50;
  string local_38;
  
  this_00 = this->GenTarget->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ADDITIONAL_CLEAN_FILES",&local_51);
  local_50._M_engaged = false;
  cmTarget::AppendProperty
            (this_00,&local_38,fileName,(optional<cmListFileBacktrace> *)&local_50,false);
  std::_Optional_payload_base<cmListFileBacktrace>::_M_reset(&local_50);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddCleanFile(std::string const& fileName)
{
  this->GenTarget->Target->AppendProperty("ADDITIONAL_CLEAN_FILES", fileName);
}